

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O0

uchar * X509_alias_get0(X509 *x,int *len)

{
  uchar *local_38;
  int local_2c;
  int *local_28;
  ASN1_UTF8STRING *alias;
  int *out_len_local;
  X509 *x_local;
  
  if (x->altname == (stack_st_GENERAL_NAME *)0x0) {
    local_28 = (int *)0x0;
  }
  else {
    local_28 = *(int **)&(x->altname->stack).sorted;
  }
  if (len != (int *)0x0) {
    if (local_28 == (int *)0x0) {
      local_2c = 0;
    }
    else {
      local_2c = *local_28;
    }
    *len = local_2c;
  }
  if (local_28 == (int *)0x0) {
    local_38 = (uchar *)0x0;
  }
  else {
    local_38 = *(uchar **)(local_28 + 2);
  }
  return local_38;
}

Assistant:

const uint8_t *X509_alias_get0(const X509 *x, int *out_len) {
  const ASN1_UTF8STRING *alias = x->aux != NULL ? x->aux->alias : NULL;
  if (out_len != NULL) {
    *out_len = alias != NULL ? alias->length : 0;
  }
  return alias != NULL ? alias->data : NULL;
}